

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

Color __thiscall Renderer::radiance(Renderer *this,Ray ray,Sampler *sampler)

{
  float fVar1;
  Light *pLVar2;
  BSDF *this_00;
  pointer ppLVar3;
  undefined1 auVar4 [16];
  vec3f vVar5;
  int iVar6;
  pointer ppLVar7;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar8;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Db;
  undefined8 extraout_XMM0_Qa;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  float extraout_XMM0_Dc_02;
  float extraout_XMM0_Dd;
  undefined8 extraout_XMM0_Qb;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar9 [16];
  float extraout_XMM0_Dd_02;
  float fVar10;
  Color CVar11;
  Ray shadowray;
  HitInfo hit;
  HitInfo shadowhit;
  char local_169;
  float local_168;
  float local_164;
  float local_160;
  int local_15c;
  undefined8 local_158;
  float local_150;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  float fStack_130;
  float fStack_12c;
  float local_124;
  vec3f local_120;
  undefined8 local_114;
  float local_10c;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  HitInfo local_e8;
  vec3f local_98;
  float local_8c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_169 = '\x01';
  iVar6 = 0;
  local_138 = 0;
  fStack_130 = 0.0;
  fStack_12c = 0.0;
  _local_148 = ZEXT816(0x3f8000003f800000);
  local_164 = 0.0;
  fVar10 = 1.0;
  while( true ) {
    if (this->max_bounces < iVar6) goto LAB_0011836b;
    local_168 = fVar10;
    (**this->acc->_vptr_Accelarator)(&local_e8,this->acc,&ray);
    if (local_e8.super_Hit.hit == false) break;
    pLVar2 = (local_e8.object)->emission;
    if ((pLVar2 != (Light *)0x0) && ((local_169 != '\0' || (pLVar2->samplable == false)))) {
      (*pLVar2->_vptr_Light[1])(pLVar2,&ray);
      fVar10 = fVar10 * local_168;
      fStack_130 = fStack_130 + extraout_XMM0_Dc * fStack_140;
      fStack_12c = fStack_12c + extraout_XMM0_Dd * fStack_13c;
      local_138 = CONCAT44(local_138._4_4_ + extraout_XMM0_Db * (float)local_148._4_4_,
                           (float)local_138 + extraout_XMM0_Da * (float)local_148._0_4_);
      local_164 = local_164 + fVar10;
    }
    this_00 = (local_e8.object)->bsdf;
    if (this_00 == (BSDF *)0x0) goto LAB_0011836b;
    local_15c = iVar6;
    BSDF::bump(this_00,&local_e8);
    ppLVar3 = (this->samplable_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl
              .super__Vector_impl_data._M_finish;
    for (ppLVar7 = (this->samplable_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppLVar7 != ppLVar3;
        ppLVar7 = ppLVar7 + 1) {
      local_158 = 0;
      local_150 = 0.0;
      (**(*ppLVar7)->_vptr_Light)(*ppLVar7,&local_e8.super_Hit.p,&local_158,&local_160,sampler);
      local_108._0_4_ = fVar10;
      local_f8 = extraout_XMM0_Qa;
      uStack_f0 = extraout_XMM0_Qb;
      local_98 = operator-(&ray.dir);
      fVar10 = local_98.z;
      (**this_00->_vptr_BSDF)(this_00,&local_98,&local_158,&local_e8);
      if (((extraout_XMM0_Da_00 != 0.0) || (NAN(extraout_XMM0_Da_00))) ||
         ((extraout_XMM0_Db_00 != 0.0 ||
          (((NAN(extraout_XMM0_Db_00) || (fVar10 != 0.0)) || (NAN(fVar10))))))) {
        fVar8 = this->geoEPS;
        local_160 = local_160 - fVar8;
        local_120.y = local_e8.super_Hit.p.y + fVar8 * (float)((ulong)local_158 >> 0x20);
        local_120.x = local_e8.super_Hit.p.x + fVar8 * (float)local_158;
        local_120.z = fVar8 * local_150 + local_e8.super_Hit.p.z;
        local_114 = local_158;
        local_10c = local_150;
        local_124 = fVar10;
        local_48 = extraout_XMM0_Da_00;
        fStack_44 = extraout_XMM0_Db_00;
        fStack_40 = extraout_XMM0_Dc_00;
        fStack_3c = extraout_XMM0_Dd_00;
        (**this->acc->_vptr_Accelarator)(&local_98,this->acc,&local_120);
        if ((local_98.x._0_1_ != '\x01') ||
           (fVar10 = (1.0 - this->geoEPS) * local_160,
           fVar10 < SQRT((local_8c - local_120.z) * (local_8c - local_120.z) +
                         (local_98.y - local_120.x) * (local_98.y - local_120.x) +
                         (local_98.z - local_120.y) * (local_98.z - local_120.y)))) {
          fVar8 = ABS(local_e8.super_Hit.Ns.z * local_150 +
                      local_e8.super_Hit.Ns.x * (float)local_158 +
                      local_e8.super_Hit.Ns.y * local_158._4_4_);
          fVar10 = (float)local_138 + fVar8 * (float)local_f8 * (float)local_148._0_4_ * local_48;
          fStack_130 = fStack_130 + fVar8 * (float)uStack_f0 * fStack_140 * fStack_40;
          fStack_12c = fStack_12c + fVar8 * uStack_f0._4_4_ * fStack_13c * fStack_3c;
          local_138 = CONCAT44(local_138._4_4_ +
                               fVar8 * local_f8._4_4_ * (float)local_148._4_4_ * fStack_44,fVar10);
          local_164 = local_164 + (float)local_108._0_4_ * local_168 * local_124 * fVar8;
        }
      }
    }
    local_98 = (vec3f)ZEXT812(0);
    local_120 = operator-(&ray.dir);
    fVar10 = local_120.z;
    (*this_00->_vptr_BSDF[1])(this_00,&local_120,&local_98,&local_e8,&local_169,sampler);
    vVar5 = local_98;
    fVar8 = ABS(local_e8.super_Hit.Ns.z * local_98.z +
                local_e8.super_Hit.Ns.x * local_98.x + local_98.y * local_e8.super_Hit.Ns.y);
    local_148._0_4_ = (float)local_148._0_4_ * fVar8 * extraout_XMM0_Da_01;
    local_148._4_4_ = (float)local_148._4_4_ * fVar8 * extraout_XMM0_Db_01;
    local_168 = local_168 * fVar10 * fVar8;
    fStack_140 = fStack_140 * fVar8 * extraout_XMM0_Dc_01;
    fStack_13c = fStack_13c * fVar8 * extraout_XMM0_Dd_01;
    if ((((((float)local_148._0_4_ == 0.0) && (!NAN((float)local_148._0_4_))) &&
         ((float)local_148._4_4_ == 0.0)) &&
        (((!NAN((float)local_148._4_4_) && (local_168 == 0.0)) && (!NAN(local_168))))) ||
       (1e+20 <= local_168 * local_168 +
                 (float)local_148._0_4_ * (float)local_148._0_4_ +
                 (float)local_148._4_4_ * (float)local_148._4_4_)) goto LAB_0011836b;
    local_f8 = CONCAT44(local_f8._4_4_,local_98.z);
    local_108._8_8_ = 0;
    local_108._0_4_ = local_98.x;
    local_108._4_4_ = local_98.y;
    local_98 = vVar5;
    fVar10 = fmaxf((float)local_148._0_4_,(float)local_148._4_4_);
    fVar10 = fmaxf(fVar10,local_168);
    if (0.1 <= (double)fVar10) {
      fVar10 = (float)local_108._0_4_;
      fVar8 = (float)local_108._4_4_;
      ray.dir.z = (float)local_f8;
    }
    else {
      auVar9._0_8_ = (double)fVar10 / 0.3;
      auVar9._8_8_ = extraout_XMM0_Qb_00;
      local_108._4_12_ = auVar9._4_12_;
      local_108._0_4_ = (undefined4)auVar9._0_8_;
      (**sampler->_vptr_Sampler)(sampler);
      if ((float)local_108._0_4_ <= extraout_XMM0_Da_02) goto LAB_0011836b;
      local_168 = local_168 / (float)local_108._0_4_;
      auVar4._4_4_ = local_108._0_4_;
      auVar4._0_4_ = local_108._0_4_;
      auVar4._8_4_ = local_108._0_4_;
      auVar4._12_4_ = local_108._0_4_;
      _local_148 = divps(_local_148,auVar4);
      fVar10 = local_98.x;
      fVar8 = local_98.y;
      ray.dir.z = local_98.z;
    }
    vVar5 = local_98;
    fVar1 = this->geoEPS;
    ray.origin.z = fVar1 * ray.dir.z + local_e8.super_Hit.p.z;
    ray.dir.x = local_98.x;
    ray.dir.y = local_98.y;
    ray.origin.y = local_e8.super_Hit.p.y + fVar1 * fVar8;
    ray.origin.x = local_e8.super_Hit.p.x + fVar1 * fVar10;
    iVar6 = local_15c + 1;
    fVar10 = local_168;
    local_98 = vVar5;
  }
  ppLVar3 = (this->global_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppLVar7 = (this->global_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppLVar7 != ppLVar3; ppLVar7 = ppLVar7 + 1) {
    (*(*ppLVar7)->_vptr_Light[1])(*ppLVar7,&ray);
    fVar10 = fVar10 * local_168;
    fStack_130 = fStack_130 + extraout_XMM0_Dc_02 * fStack_140;
    fStack_12c = fStack_12c + extraout_XMM0_Dd_02 * fStack_13c;
    local_138 = CONCAT44(local_138._4_4_ + extraout_XMM0_Db_02 * (float)local_148._4_4_,
                         (float)local_138 + extraout_XMM0_Da_03 * (float)local_148._0_4_);
    local_164 = local_164 + fVar10;
  }
LAB_0011836b:
  CVar11.z = local_164;
  CVar11.x = (float)local_138;
  CVar11.y = local_138._4_4_;
  return CVar11;
}

Assistant:

Color Renderer::radiance(Ray ray, Sampler& sampler)
{
	Color through(1);
	Color result;
	bool lastDirac = true; // accept all light sources if directly into camera
	for (int nbounce = 0; nbounce <= max_bounces; nbounce++)
	{
		HitInfo hit = acc->hit(ray);
		if (!hit) {
			for (Light* l: global_lights)
				result += through * l->radiance(ray);
			break;
		}
		if (hit.object->emission) {
			if (lastDirac || !hit.object->emission->samplable)
				result += through * hit.object->emission->radiance(ray);
		}
		BSDF* bsdf = hit.object->bsdf;
		if (!bsdf) break;
		bsdf->bump(hit);
		// direct light
		for (Light* l: samplable_lights) {
			vec3f dirToLight;
			float dist;
			Color irr = l->sampleIrradiance(hit.p, dirToLight, dist, sampler);
			Color f = bsdf->f(-ray.dir, dirToLight, hit);
			if (f == vec3f(0)) continue;
			dist -= geoEPS; // cancel amount that ray origin is moved forward
			// shadow ray test
			Ray shadowray(hit.p + geoEPS * dirToLight, dirToLight);
			HitInfo shadowhit = acc->hit(shadowray);
			if (!shadowhit || norm(shadowhit.p - shadowray.origin) > (1-geoEPS) * dist)
				result += through * irr * f * fabs(dot(hit.Ns, dirToLight));
		}
		// indirect light (bsdf importance sampling)
		vec3f newdir;
		Color f = bsdf->sample_f(-ray.dir, newdir, hit, lastDirac, sampler); // already scaled by 1/pdf
		through *= fabs(dot(newdir, hit.Ns)) * f;
		if (through == vec3f() || !(sqrlen(through) < 1e20)) break;
		// russian roulette
		float t = fmax(fmax(through.x, through.y), through.z);
		if (t < 0.1) {
			float p = t / 0.3;
			if (sampler.get1f() >= p) break;
			through = through / p;
		}
		ray = Ray(hit.p + geoEPS*newdir, newdir);
	}
	return result;
}